

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * u8tou8(char *source)

{
  size_t sVar1;
  char *pcVar2;
  
  if (source == (char *)0x0) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
  }
  else {
    sVar1 = strlen(source);
    pcVar2 = (char *)malloc(sVar1 + 1);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = strcpy(pcVar2,source);
      return pcVar2;
    }
    g_lastError = OPENJTALKERROR_MALLOC_ERROR;
  }
  return (char *)0x0;
}

Assistant:

char *u8tou8(const char *source)
{
	if (source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char *temp = (char *)malloc(strlen(source) + 1);
	if (!temp)
	{
		g_lastError = OPENJTALKERROR_MALLOC_ERROR;
		return NULL;
	}
	return strcpy(temp, source);
}